

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall
btMatrixX<float>::multiply2_p8r
          (btMatrixX<float> *this,btScalar *B,btScalar *C,int numRows,int numRowsOther,int row,
          int col)

{
  int in_ECX;
  btMatrixX<float> *in_RDI;
  int in_R8D;
  btScalar sum;
  int j;
  btScalar *cc;
  int i;
  btScalar *bb;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 local_44;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
    for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
      setElem(in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0.0);
    }
  }
  return;
}

Assistant:

void multiply2_p8r (const btScalar *B, const btScalar *C,  int numRows,  int numRowsOther, int row, int col)
	{
		btAssert (numRows>0 && numRowsOther>0 && B && C);
		const btScalar *bb = B;
		for ( int i = 0;i<numRows;i++)
		{
			const btScalar *cc = C;
			for ( int j = 0;j<numRowsOther;j++)
			{
				btScalar sum;
				sum  = bb[0]*cc[0];
				sum += bb[1]*cc[1];
				sum += bb[2]*cc[2];
				sum += bb[4]*cc[4];
				sum += bb[5]*cc[5];
				sum += bb[6]*cc[6];
				setElem(row+i,col+j,sum);
				cc += 8;
			}
			bb += 8;
		}
	}